

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O3

RPCHelpMan * getblock(void)

{
  size_type *psVar1;
  ulong *puVar2;
  long *plVar3;
  string name;
  string name_00;
  string cond;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string m_key_name_12;
  string m_key_name_13;
  string m_key_name_14;
  string m_key_name_15;
  string m_key_name_16;
  string cond_00;
  string m_key_name_17;
  string m_key_name_18;
  string m_key_name_19;
  string m_key_name_20;
  string m_key_name_21;
  string cond_01;
  string m_key_name_22;
  string m_key_name_23;
  string m_key_name_24;
  string cond_02;
  string name_01;
  string m_key_name_25;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  string m_key_name_26;
  string description_19;
  string description_20;
  string description_21;
  string description_22;
  string description_23;
  string m_key_name_27;
  string description_24;
  string description_25;
  string description_26;
  string m_key_name_28;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_18;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_19;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_20;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_21;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_22;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_23;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_24;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_25;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_26;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  string description_27;
  string description_28;
  string description_29;
  string description_30;
  RPCResults results;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_27;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_28;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_29;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_30;
  RPCExamples examples;
  string description_31;
  string description_32;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  undefined1 auVar4 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long lVar8;
  RPCHelpMan *in_RDI;
  undefined8 uVar9;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  initializer_list<RPCResult> __l_06;
  initializer_list<RPCResult> __l_07;
  initializer_list<RPCResult> __l_08;
  undefined4 in_stack_ffffffffffffdbd8;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffdbdc;
  undefined8 in_stack_ffffffffffffdbe0;
  undefined8 in_stack_ffffffffffffdbf0;
  undefined8 in_stack_ffffffffffffdbf8;
  RPCResult *pRVar11;
  undefined8 in_stack_ffffffffffffdc00;
  RPCArg *pRVar12;
  undefined8 in_stack_ffffffffffffdc08;
  undefined8 in_stack_ffffffffffffdc10;
  undefined8 in_stack_ffffffffffffdc18;
  code *pcVar13;
  undefined8 in_stack_ffffffffffffdc20;
  pointer in_stack_ffffffffffffdc28;
  pointer in_stack_ffffffffffffdc30;
  undefined1 in_stack_ffffffffffffdc38 [16];
  pointer in_stack_ffffffffffffdc48;
  pointer in_stack_ffffffffffffdc50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffdc58;
  pointer in_stack_ffffffffffffdc68;
  pointer in_stack_ffffffffffffdc70;
  pointer in_stack_ffffffffffffdc78;
  undefined1 auVar14 [32];
  undefined1 in_stack_ffffffffffffdc80 [40];
  pointer in_stack_ffffffffffffdca8;
  pointer in_stack_ffffffffffffdcb0;
  pointer in_stack_ffffffffffffdcb8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2338;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2318;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2300;
  vector<RPCResult,_std::allocator<RPCResult>_> local_22e8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_22c8;
  allocator_type local_22a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_22a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2288;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2268;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2248;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2228;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2208;
  vector<RPCResult,_std::allocator<RPCResult>_> local_21e8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_21c8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_21a8;
  allocator_type local_2189;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2188;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2170;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2158;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2138;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2118;
  vector<RPCResult,_std::allocator<RPCResult>_> local_20f8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_20d8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_20b8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2098;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2078;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2058;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2040;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2028;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2010;
  allocator_type local_1ff5;
  int local_1ff4;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1ff0;
  string local_1fd8;
  string local_1fb8;
  string local_1f98;
  string local_1f78;
  string local_1f58;
  string local_1f38;
  ulong *local_1f18;
  undefined8 local_1f10;
  ulong local_1f08;
  undefined8 uStack_1f00;
  ulong *local_1ef8;
  size_type local_1ef0;
  ulong local_1ee8;
  undefined8 uStack_1ee0;
  RPCResult local_1ed8;
  long *local_1e50 [2];
  long local_1e40 [2];
  long *local_1e30 [2];
  long local_1e20 [2];
  RPCResult local_1e10;
  long *local_1d88 [2];
  long local_1d78 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1d68;
  long *local_1d48 [2];
  long local_1d38 [2];
  pointer local_1d28 [2];
  undefined1 local_1d18 [152];
  RPCResult local_1c80;
  long *local_1bf8 [2];
  long local_1be8 [2];
  long *local_1bd8 [2];
  long local_1bc8 [2];
  long *local_1bb8 [2];
  long local_1ba8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b98;
  size_type *local_1b78;
  size_type local_1b70;
  size_type local_1b68 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b58;
  long *local_1b38 [2];
  long local_1b28 [2];
  pointer local_1b18 [2];
  undefined1 local_1b08 [152];
  RPCResult local_1a70;
  long *local_19e8 [2];
  long local_19d8 [2];
  long *local_19c8 [2];
  long local_19b8 [2];
  RPCResult local_19a8;
  long *local_1920 [2];
  long local_1910 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1900;
  long *local_18e0 [2];
  long local_18d0 [2];
  long *local_18c0 [2];
  long local_18b0 [2];
  RPCResult local_18a0;
  RPCResult local_1818;
  long *local_1790 [2];
  long local_1780 [2];
  long *local_1770 [2];
  long local_1760 [2];
  long *local_1750 [2];
  long local_1740 [2];
  long *local_1730 [2];
  long local_1720 [2];
  long *local_1710 [2];
  long local_1700 [2];
  long *local_16f0 [2];
  long local_16e0 [2];
  long *local_16d0 [2];
  long local_16c0 [2];
  long *local_16b0 [2];
  long local_16a0 [2];
  long *local_1690 [2];
  long local_1680 [2];
  long *local_1670 [2];
  long local_1660 [2];
  long *local_1650 [2];
  long local_1640 [2];
  long *local_1630 [2];
  long local_1620 [2];
  long *local_1610 [2];
  long local_1600 [2];
  long *local_15f0 [2];
  long local_15e0 [2];
  long *local_15d0 [2];
  long local_15c0 [2];
  long *local_15b0 [2];
  long local_15a0 [2];
  long *local_1590 [2];
  long local_1580 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1570;
  long *local_1550 [2];
  long local_1540 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1530;
  long *local_1510 [2];
  long local_1500 [2];
  long *local_14f0 [2];
  long local_14e0 [2];
  long *local_14d0 [2];
  long local_14c0 [2];
  RPCResult local_14b0;
  long *local_1428 [2];
  long local_1418 [2];
  long *local_1408 [2];
  long local_13f8 [2];
  long *local_13e8 [2];
  long local_13d8 [2];
  long *local_13c8 [2];
  long local_13b8 [2];
  long *local_13a8 [2];
  long local_1398 [2];
  long *local_1388 [2];
  long local_1378 [2];
  long *local_1368 [2];
  long local_1358 [2];
  long *local_1348 [2];
  long local_1338 [2];
  long *local_1328 [2];
  long local_1318 [2];
  long *local_1308 [2];
  long local_12f8 [2];
  long *local_12e8 [2];
  long local_12d8 [2];
  long *local_12c8 [2];
  long local_12b8 [2];
  long *local_12a8 [2];
  long local_1298 [2];
  long *local_1288 [2];
  long local_1278 [2];
  long *local_1268 [2];
  long local_1258 [2];
  long *local_1248 [2];
  long local_1238 [2];
  long *local_1228 [2];
  long local_1218 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1208;
  long *local_11e8 [2];
  long local_11d8 [2];
  pointer local_11c8 [2];
  undefined1 local_11b8 [152];
  RPCResult local_1120;
  RPCResult local_1098;
  RPCResult local_1010;
  RPCResult local_f88;
  RPCResult local_f00;
  RPCResult local_e78;
  RPCResult local_df0;
  RPCResult local_d68;
  RPCResult local_ce0;
  RPCResult local_c58;
  RPCResult local_bd0;
  RPCResult local_b48;
  RPCResult local_ac0;
  RPCResult local_a38;
  RPCResult local_9b0;
  RPCResult local_928;
  RPCResult local_8a0;
  RPCResult local_818;
  long *local_790 [2];
  long local_780 [2];
  long *local_770 [2];
  long local_760 [2];
  long *local_750 [2];
  long local_740 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_730;
  long *local_710 [2];
  long local_700 [2];
  long *local_6f0 [2];
  long local_6e0 [2];
  RPCResult local_6d0;
  RPCResult local_648;
  RPCResult local_5c0;
  RPCResult local_538;
  undefined1 local_4b0;
  undefined1 *local_4a8;
  undefined8 local_4a0;
  undefined1 local_498;
  undefined7 uStack_497;
  undefined1 local_488 [32];
  long *local_468 [2];
  long local_458 [2];
  UniValue local_448;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_3f0;
  undefined1 local_398;
  long *local_390 [2];
  long local_380 [2];
  undefined1 local_370;
  vector<RPCArg,_std::allocator<RPCArg>_> local_368;
  undefined1 auStack_350 [8];
  undefined1 local_348 [32];
  long *local_328 [2];
  long local_318 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_308;
  undefined1 local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1098.m_cond._M_dataplus._M_p = (pointer)0x0;
  local_2040.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getblock","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nIf verbosity is 0, returns a string that is serialized, hex-encoded data for block \'hash\'.\nIf verbosity is 1, returns an Object with information about block <hash>.\nIf verbosity is 2, returns an Object with information about block <hash> and information about each transaction.\nIf verbosity is 3, returns an Object with information about block <hash> and information about each transaction, including prevout information for inputs (only for unpruned blocks in the current best chain).\n"
             ,"");
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_2a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"blockhash","");
  local_308._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_2b0 = 0;
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"The block hash","");
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_370 = 0;
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_348._0_8_ = (pointer)0x0;
  local_348._8_2_ = 0;
  local_348._10_6_ = 0;
  local_348._16_2_ = 0;
  local_348._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdbd8;
  name._M_string_length = in_stack_ffffffffffffdbe0;
  name.field_2._M_allocated_capacity = (size_type)in_RDI;
  name.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffdc00;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffdbf8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffdc08;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffdc10;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffdc18;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffdc20;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffdc28;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffdc30;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_16_ = in_stack_ffffffffffffdc38;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffdc48;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffdc50;
  description_31.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffdc68;
  description_31._0_16_ = in_stack_ffffffffffffdc58;
  description_31.field_2._8_8_ = in_stack_ffffffffffffdc70;
  auVar14 = in_stack_ffffffffffffdc80._0_32_;
  opts.oneline_description._M_dataplus._M_p = (pointer)auVar14._0_8_;
  opts.oneline_description._M_string_length = auVar14._8_8_;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar14._16_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffdc80._32_8_;
  opts._0_8_ = in_stack_ffffffffffffdc78;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffdca8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffdcb0;
  opts._64_8_ = in_stack_ffffffffffffdcb8;
  RPCArg::RPCArg(&local_288,name,(Type)&local_2a8,fallback,description_31,opts);
  local_390[0] = local_380;
  pRVar12 = &local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"verbosity|verbose","");
  local_1ff4 = 1;
  UniValue::UniValue<int,_int,_true>(&local_448,&local_1ff4);
  paVar7 = &local_448.val.field_2;
  local_3f0._8_8_ = (long)&local_3f0 + 0x18;
  local_3f0._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_448.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448.val._M_dataplus._M_p == paVar7) {
    local_3f0._32_8_ = local_448.val.field_2._8_8_;
  }
  else {
    local_3f0._8_8_ = local_448.val._M_dataplus._M_p;
  }
  local_3f0._16_8_ = local_448.val._M_string_length;
  local_448.val._M_string_length = 0;
  local_448.val.field_2._M_local_buf[0] = '\0';
  local_3f0._40_8_ =
       local_448.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3f0._48_8_ =
       local_448.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3f0._56_8_ =
       local_448.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_448.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f0._64_4_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_3f0._68_4_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_3f0._72_4_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_3f0._76_4_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_3f0._80_8_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398 = 2;
  local_468[0] = local_458;
  local_448.val._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_468,
             "0 for hex-encoded data, 1 for a JSON object, 2 for JSON object with transaction data, and 3 for JSON object with transaction data including prevout information for inputs"
             ,"");
  local_4a8 = &local_498;
  local_4b0 = 1;
  local_4a0 = 0;
  local_498 = 0;
  local_488._0_8_ = (pointer)0x0;
  local_488._8_2_ = 0;
  local_488._10_6_ = 0;
  local_488._16_2_ = 0;
  local_488._18_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdbd8;
  name_00._M_string_length = in_stack_ffffffffffffdbe0;
  name_00.field_2._M_allocated_capacity = (size_type)in_RDI;
  name_00.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = pRVar12;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffdbf8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffdc08;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffdc10;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffdc18;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffdc20;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffdc28;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffdc30;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_16_ = in_stack_ffffffffffffdc38;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffdc48;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffdc50;
  description_32.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffdc68;
  description_32._0_16_ = in_stack_ffffffffffffdc58;
  description_32.field_2._8_8_ = in_stack_ffffffffffffdc70;
  auVar14 = in_stack_ffffffffffffdc80._0_32_;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)auVar14._0_8_;
  opts_00.oneline_description._M_string_length = auVar14._8_8_;
  opts_00.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar14._16_16_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffdc80._32_8_;
  opts_00._0_8_ = in_stack_ffffffffffffdc78;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffdca8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffdcb0;
  opts_00._64_8_ = in_stack_ffffffffffffdcb8;
  RPCArg::RPCArg(&local_180,name_00,(Type)local_390,fallback_00,description_32,opts_00);
  __l._M_len = 2;
  __l._M_array = &local_288;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1ff0,__l,&local_1ff5);
  local_6f0[0] = local_6e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f0,"for verbosity = 0","");
  local_710[0] = local_700;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"");
  local_730.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_730.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_730,"A string that is serialized, hex-encoded data for block \'hash\'"
             ,"");
  local_2028.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2028.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2028.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cond._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  cond._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdbd8;
  cond._M_string_length = in_stack_ffffffffffffdbe0;
  cond.field_2._M_allocated_capacity = (size_type)in_RDI;
  cond.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  m_key_name_25._M_string_length = (size_type)pRVar12;
  m_key_name_25._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  m_key_name_25.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  m_key_name_25.field_2._8_8_ = in_stack_ffffffffffffdc10;
  description_27._M_string_length = in_stack_ffffffffffffdc20;
  description_27._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdc18;
  description_27.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffdc28;
  description_27.field_2._8_8_ = in_stack_ffffffffffffdc30;
  inner_27.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffdc48;
  inner_27.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc38._0_8_;
  inner_27.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc38._8_8_;
  RPCResult::RPCResult(&local_6d0,cond,(Type)local_6f0,m_key_name_25,description_27,inner_27);
  local_750[0] = local_740;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_750,"for verbosity = 1","");
  local_770[0] = local_760;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_770,"");
  local_790[0] = local_780;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"");
  local_11c8[0] = (pointer)local_11b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_11c8,"hash","");
  local_11e8[0] = local_11d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_11e8,"the block hash (same as provided)","");
  local_2058.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2058.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2058.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdbd8;
  m_key_name._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description._M_string_length = (size_type)pRVar12;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  description.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffdc18;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult
            ((RPCResult *)(local_11b8 + 0x10),STR_HEX,m_key_name,description,inner,
             SUB81(local_11c8,0));
  local_1208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_1208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1208,"confirmations","");
  local_1228[0] = local_1218;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1228,
             "The number of confirmations, or -1 if the block is not on the main chain","");
  local_2078.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2078.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2078.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdbd8;
  m_key_name_00._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_00.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_00._M_string_length = (size_type)pRVar12;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  description_00.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_00.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult(&local_1120,NUM,m_key_name_00,description_00,inner_00,SUB81(&local_1208,0));
  local_1248[0] = local_1238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1248,"size","");
  local_1268[0] = local_1258;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1268,"The block size","");
  local_2098.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2098.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2098.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdbd8;
  m_key_name_01._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_01.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_01._M_string_length = (size_type)pRVar12;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  description_01.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_01.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult(&local_1098,NUM,m_key_name_01,description_01,inner_01,SUB81(local_1248,0));
  local_1288[0] = local_1278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1288,"strippedsize","");
  local_12a8[0] = local_1298;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12a8,"The block size excluding witness data","");
  local_20b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_20b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_20b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdbd8;
  m_key_name_02._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_02.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_02._M_string_length = (size_type)pRVar12;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  description_02.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_02.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult(&local_1010,NUM,m_key_name_02,description_02,inner_02,SUB81(local_1288,0));
  local_12c8[0] = local_12b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_12c8,"weight","");
  local_12e8[0] = local_12d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12e8,"The block weight as defined in BIP 141","");
  local_20d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_20d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_20d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_03._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdbd8;
  m_key_name_03._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_03.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_03._M_string_length = (size_type)pRVar12;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  description_03.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_03.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult(&local_f88,NUM,m_key_name_03,description_03,inner_03,SUB81(local_12c8,0));
  local_1308[0] = local_12f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1308,"height","");
  local_1328[0] = local_1318;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1328,"The block height or index","");
  local_20f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_20f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_20f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_04._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdbd8;
  m_key_name_04._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_04.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_04._M_string_length = (size_type)pRVar12;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  description_04.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_04.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult(&local_f00,NUM,m_key_name_04,description_04,inner_04,SUB81(local_1308,0));
  local_1348[0] = local_1338;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1348,"version","");
  local_1368[0] = local_1358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1368,"The block version","");
  local_2118.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2118.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2118.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_05._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdbd8;
  m_key_name_05._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_05.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_05.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_05._M_string_length = (size_type)pRVar12;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  description_05.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_05.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult(&local_e78,NUM,m_key_name_05,description_05,inner_05,SUB81(local_1348,0));
  local_1388[0] = local_1378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1388,"versionHex","");
  local_13a8[0] = local_1398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13a8,"The block version formatted in hexadecimal","");
  local_2138.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2138.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2138.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_06._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdbd8;
  m_key_name_06._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_06.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_06._M_string_length = (size_type)pRVar12;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  description_06.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_06.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult(&local_df0,STR_HEX,m_key_name_06,description_06,inner_06,SUB81(local_1388,0))
  ;
  local_13c8[0] = local_13b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13c8,"merkleroot","");
  local_13e8[0] = local_13d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13e8,"The merkle root","");
  local_2158.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2158.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2158.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_07._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdbd8;
  m_key_name_07._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_07.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_07.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_07._M_string_length = (size_type)pRVar12;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  description_07.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_07.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult(&local_d68,STR_HEX,m_key_name_07,description_07,inner_07,SUB81(local_13c8,0))
  ;
  local_1408[0] = local_13f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1408,"tx","");
  local_1428[0] = local_1418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1428,"The transaction ids","");
  local_14d0[0] = local_14c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_14d0,"");
  local_14f0[0] = local_14e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_14f0,"The transaction id","");
  local_2188.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2188.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2188.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_08._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdbd8;
  m_key_name_08._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_08.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_08.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_08._M_string_length = (size_type)pRVar12;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  description_08.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_08.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult
            (&local_14b0,STR_HEX,m_key_name_08,description_08,inner_08,SUB81(local_14d0,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_14b0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_2170,__l_00,&local_2189);
  m_key_name_09._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_09._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdbd8;
  m_key_name_09._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_09.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_09.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_09._M_string_length = (size_type)pRVar12;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  description_09.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_09.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult(&local_ce0,ARR,m_key_name_09,description_09,inner_09,SUB81(local_1408,0));
  local_1510[0] = local_1500;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1510,"time","");
  std::operator+(&local_1530,"The block time expressed in ",&UNIX_EPOCH_TIME_abi_cxx11_);
  local_21a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_21a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_21a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_10._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_10._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdbd8;
  m_key_name_10._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_10.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_10.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_10._M_string_length = (size_type)pRVar12;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  description_10.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_10.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult
            (&local_c58,NUM_TIME,m_key_name_10,description_10,inner_10,SUB81(local_1510,0));
  local_1550[0] = local_1540;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1550,"mediantime","");
  std::operator+(&local_1570,"The median block time expressed in ",&UNIX_EPOCH_TIME_abi_cxx11_);
  local_21c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_21c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_21c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_11._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_11._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdbd8;
  m_key_name_11._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_11.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_11.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_11._M_string_length = (size_type)pRVar12;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  description_11.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_11.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult
            (&local_bd0,NUM_TIME,m_key_name_11,description_11,inner_11,SUB81(local_1550,0));
  local_1590[0] = local_1580;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1590,"nonce","");
  local_15b0[0] = local_15a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_15b0,"The nonce","");
  local_21e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_21e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_21e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_12._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_12._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdbd8;
  m_key_name_12._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_12.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_12.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_12._M_string_length = (size_type)pRVar12;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  description_12.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_12.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult(&local_b48,NUM,m_key_name_12,description_12,inner_12,SUB81(local_1590,0));
  local_15d0[0] = local_15c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_15d0,"bits","");
  local_15f0[0] = local_15e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_15f0,"The bits","");
  local_2208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_13._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_13._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdbd8;
  m_key_name_13._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_13.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_13.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_13._M_string_length = (size_type)pRVar12;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  description_13.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_13.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult(&local_ac0,STR_HEX,m_key_name_13,description_13,inner_13,SUB81(local_15d0,0))
  ;
  local_1610[0] = local_1600;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1610,"difficulty","");
  local_1630[0] = local_1620;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1630,"The difficulty","");
  local_2228.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2228.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2228.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_14._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_14._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdbd8;
  m_key_name_14._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_14.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_14.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_14._M_string_length = (size_type)pRVar12;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  description_14.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_14.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult(&local_a38,NUM,m_key_name_14,description_14,inner_14,SUB81(local_1610,0));
  local_1650[0] = local_1640;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1650,"chainwork","");
  local_1670[0] = local_1660;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1670,
             "Expected number of hashes required to produce the chain up to this block (in hex)","")
  ;
  local_2248.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2248.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2248.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_15._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_15._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdbd8;
  m_key_name_15._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_15.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_15.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_15._M_string_length = (size_type)pRVar12;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  description_15.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_15.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult(&local_9b0,STR_HEX,m_key_name_15,description_15,inner_15,SUB81(local_1650,0))
  ;
  local_1690[0] = local_1680;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1690,"nTx","");
  local_16b0[0] = local_16a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16b0,"The number of transactions in the block","");
  local_2268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_16._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_16._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffdbd8;
  m_key_name_16._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_16.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_16.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_16._M_string_length = (size_type)pRVar12;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  description_16.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_16.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult(&local_928,NUM,m_key_name_16,description_16,inner_16,SUB81(local_1690,0));
  local_16d0[0] = local_16c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_16d0,"previousblockhash","");
  local_16f0[0] = local_16e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16f0,"The hash of the previous block (if available)","");
  local_2288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar14._4_8_ = in_stack_ffffffffffffdbe0;
  auVar14._0_4_ = in_stack_ffffffffffffdbdc;
  auVar14._12_8_ = in_RDI;
  auVar14._20_8_ = in_stack_ffffffffffffdbf0;
  auVar14._28_4_ = 0;
  description_17._M_string_length = (size_type)pRVar12;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  description_17.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_17.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult
            (&local_8a0,STR_HEX,(string)(auVar14 << 0x20),SUB81(local_16d0,0),description_17,
             inner_17,true);
  local_1710[0] = local_1700;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1710,"nextblockhash","");
  local_1730[0] = local_1720;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1730,"The hash of the next block (if available)","");
  local_22a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_22a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_22a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar10 = 0;
  auVar4._4_8_ = in_stack_ffffffffffffdbe0;
  auVar4._0_4_ = in_stack_ffffffffffffdbdc;
  auVar4._12_8_ = in_RDI;
  auVar4._20_8_ = in_stack_ffffffffffffdbf0;
  auVar4._28_4_ = 0;
  description_18._M_string_length = (size_type)pRVar12;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  description_18.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_18.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult
            (&local_818,STR_HEX,(string)(auVar4 << 0x20),SUB81(local_1710,0),description_18,inner_18
             ,true);
  __l_01._M_len = 0x13;
  __l_01._M_array = (iterator)(local_11b8 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_2040,__l_01,&local_22a9);
  cond_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  cond_00._M_dataplus._M_p._0_4_ = uVar10;
  cond_00._M_string_length = in_stack_ffffffffffffdbe0;
  cond_00.field_2._M_allocated_capacity = (size_type)in_RDI;
  cond_00.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  m_key_name_26._M_string_length = (size_type)pRVar12;
  m_key_name_26._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  m_key_name_26.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  m_key_name_26.field_2._8_8_ = in_stack_ffffffffffffdc10;
  description_28._M_string_length = in_stack_ffffffffffffdc20;
  description_28._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdc18;
  description_28.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffdc28;
  description_28.field_2._8_8_ = in_stack_ffffffffffffdc30;
  inner_28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffdc48;
  inner_28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc38._0_8_;
  inner_28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc38._8_8_;
  RPCResult::RPCResult(&local_648,cond_00,(Type)local_750,m_key_name_26,description_28,inner_28);
  local_1750[0] = local_1740;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1750,"for verbosity = 2","");
  local_1770[0] = local_1760;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1770,"");
  local_1790[0] = local_1780;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1790,"");
  local_18c0[0] = local_18b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_18c0,"");
  local_18e0[0] = local_18d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_18e0,"Same output as verbosity = 1","");
  local_22e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_22e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_22e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_17._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_17._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_17._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_17.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_17.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_19._M_string_length = (size_type)pRVar12;
  description_19._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdbf8;
  description_19.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_19.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult
            (&local_18a0,ELISION,m_key_name_17,description_19,inner_19,SUB81(local_18c0,0));
  pRVar11 = &local_1818;
  local_1900.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_1900.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1900,"tx","");
  local_1920[0] = local_1910;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1920,"");
  local_19c8[0] = local_19b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_19c8,"");
  local_19e8[0] = local_19d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_19e8,"");
  local_1b18[0] = (pointer)local_1b08;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b18,"");
  local_1b38[0] = local_1b28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b38,
             "The transactions in the format of the getrawtransaction RPC. Different from verbosity = 1 \"tx\" result"
             ,"");
  local_2338.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2338.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2338.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_18._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_18._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_18._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_18.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_18.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_20._M_string_length = (size_type)pRVar12;
  description_20._M_dataplus._M_p = (pointer)pRVar11;
  description_20.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_20.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult
            ((RPCResult *)(local_1b08 + 0x10),ELISION,m_key_name_18,description_20,inner_20,
             SUB81(local_1b18,0));
  local_1b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_1b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b58,"fee","");
  std::operator+(&local_1b98,"The transaction fee in ",&CURRENCY_UNIT_abi_cxx11_);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_1b98,", omitted if block undo data is not available");
  local_1b78 = local_1b68;
  psVar1 = (size_type *)(pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar7) {
    local_1b68[0] = paVar7->_M_allocated_capacity;
    local_1b68[1] = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_1b68[0] = paVar7->_M_allocated_capacity;
    local_1b78 = psVar1;
  }
  local_1b70 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  m_key_name_19._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_19._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_19._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_19.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_19.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_21._M_string_length = (size_type)pRVar12;
  description_21._M_dataplus._M_p = (pointer)pRVar11;
  description_21.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_21.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult(&local_1a70,NUM,m_key_name_19,description_21,inner_21,SUB81(&local_1b58,0));
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)(local_1b08 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_2318,__l_02,(allocator_type *)&stack0xffffffffffffdca7);
  m_key_name_20._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_20._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_20._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_20.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_20.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_22._M_string_length = (size_type)pRVar12;
  description_22._M_dataplus._M_p = (pointer)pRVar11;
  description_22.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_22.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult(&local_19a8,OBJ,m_key_name_20,description_22,inner_22,SUB81(local_19c8,0));
  __l_03._M_len = 1;
  __l_03._M_array = &local_19a8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_2300,__l_03,(allocator_type *)&stack0xffffffffffffdca6);
  m_key_name_21._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_21._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_21._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_21.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_21.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_23._M_string_length = (size_type)pRVar12;
  description_23._M_dataplus._M_p = (pointer)pRVar11;
  description_23.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_23.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult(&local_1818,ARR,m_key_name_21,description_23,inner_23,false);
  __l_04._M_len = 2;
  __l_04._M_array = &local_18a0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_22c8,__l_04,(allocator_type *)&stack0xffffffffffffdca5);
  cond_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  cond_01._M_dataplus._M_p._0_4_ = uVar10;
  cond_01._M_string_length = in_stack_ffffffffffffdbe0;
  cond_01.field_2._M_allocated_capacity = (size_type)in_RDI;
  cond_01.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  m_key_name_27._M_string_length = (size_type)pRVar12;
  m_key_name_27._M_dataplus._M_p = (pointer)pRVar11;
  m_key_name_27.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  m_key_name_27.field_2._8_8_ = in_stack_ffffffffffffdc10;
  description_29._M_string_length = in_stack_ffffffffffffdc20;
  description_29._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdc18;
  description_29.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffdc28;
  description_29.field_2._8_8_ = in_stack_ffffffffffffdc30;
  inner_29.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffdc48;
  inner_29.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc38._0_8_;
  inner_29.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc38._8_8_;
  RPCResult::RPCResult(&local_5c0,cond_01,(Type)local_1750,m_key_name_27,description_29,inner_29);
  local_1bb8[0] = local_1ba8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1bb8,"for verbosity = 3","");
  local_1bd8[0] = local_1bc8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1bd8,"");
  local_1bf8[0] = local_1be8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1bf8,"");
  local_1d28[0] = (pointer)local_1d18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d28,"");
  local_1d48[0] = local_1d38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d48,"Same output as verbosity = 2","");
  m_key_name_22._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_22._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_22._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_22.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_22.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_24._M_string_length = (size_type)pRVar12;
  description_24._M_dataplus._M_p = (pointer)pRVar11;
  description_24.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_24.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult
            ((RPCResult *)(local_1d18 + 0x10),ELISION,m_key_name_22,description_24,inner_24,
             SUB81(local_1d28,0));
  local_1d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_1d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d68,"tx","");
  local_1d88[0] = local_1d78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d88,"");
  local_1e30[0] = local_1e20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e30,"");
  local_1e50[0] = local_1e40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e50,"");
  RPCResult::RPCResult(&local_1ed8,&getblock_vin);
  __l_05._M_len = 1;
  __l_05._M_array = &local_1ed8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffdc38,__l_05,
             (allocator_type *)&stack0xffffffffffffdc37);
  m_key_name_23._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_23._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_23._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_23.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_23.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_25._M_string_length = (size_type)pRVar12;
  description_25._M_dataplus._M_p = (pointer)pRVar11;
  description_25.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_25.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult(&local_1e10,OBJ,m_key_name_23,description_25,inner_25,SUB81(local_1e30,0));
  __l_06._M_len = 1;
  __l_06._M_array = &local_1e10;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffdc50,__l_06,
             (allocator_type *)&stack0xffffffffffffdc36);
  m_key_name_24._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  m_key_name_24._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_24._M_string_length = in_stack_ffffffffffffdbe0;
  m_key_name_24.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_24.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  description_26._M_string_length = (size_type)pRVar12;
  description_26._M_dataplus._M_p = (pointer)pRVar11;
  description_26.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  description_26.field_2._8_8_ = in_stack_ffffffffffffdc10;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc20;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc18;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffdc28;
  RPCResult::RPCResult(&local_1c80,ARR,m_key_name_24,description_26,inner_26,SUB81(&local_1d68,0));
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)(local_1d18 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffdc88,__l_07,
             (allocator_type *)&stack0xffffffffffffdc35);
  cond_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffdbdc;
  cond_02._M_dataplus._M_p._0_4_ = uVar10;
  cond_02._M_string_length = in_stack_ffffffffffffdbe0;
  cond_02.field_2._M_allocated_capacity = (size_type)in_RDI;
  cond_02.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  m_key_name_28._M_string_length = (size_type)pRVar12;
  m_key_name_28._M_dataplus._M_p = (pointer)pRVar11;
  m_key_name_28.field_2._M_allocated_capacity = in_stack_ffffffffffffdc08;
  m_key_name_28.field_2._8_8_ = in_stack_ffffffffffffdc10;
  description_30._M_string_length = in_stack_ffffffffffffdc20;
  description_30._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdc18;
  description_30.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffdc28;
  description_30.field_2._8_8_ = in_stack_ffffffffffffdc30;
  inner_30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffdc48;
  inner_30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffdc38._0_8_;
  inner_30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffdc38._8_8_;
  RPCResult::RPCResult(&local_538,cond_02,(Type)local_1bb8,m_key_name_28,description_30,inner_30);
  __l_08._M_len = 4;
  __l_08._M_array = &local_6d0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_2010,__l_08,(allocator_type *)&local_1f38);
  local_1f58._M_dataplus._M_p = (pointer)&local_1f58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f58,"getblock","");
  local_1f78._M_dataplus._M_p = (pointer)&local_1f78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f78,
             "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"","");
  HelpExampleCli(&local_1f38,&local_1f58,&local_1f78);
  local_1fb8._M_dataplus._M_p = (pointer)&local_1fb8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1fb8,"getblock","");
  local_1fd8._M_dataplus._M_p = (pointer)&local_1fd8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1fd8,
             "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"","");
  HelpExampleRpc(&local_1f98,&local_1fb8,&local_1fd8);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f38._M_dataplus._M_p != &local_1f38.field_2) {
    uVar9 = local_1f38.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_1f98._M_string_length + local_1f38._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f98._M_dataplus._M_p != &local_1f98.field_2) {
      uVar9 = local_1f98.field_2._M_allocated_capacity;
    }
    if (local_1f98._M_string_length + local_1f38._M_string_length <= (ulong)uVar9) {
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_1f98,0,0,local_1f38._M_dataplus._M_p,local_1f38._M_string_length);
      goto LAB_009ac0a0;
    }
  }
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_1f38,local_1f98._M_dataplus._M_p,local_1f98._M_string_length);
LAB_009ac0a0:
  local_1f18 = &local_1f08;
  puVar2 = (ulong *)(pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar7) {
    local_1f08 = paVar7->_M_allocated_capacity;
    uStack_1f00 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_1f08 = paVar7->_M_allocated_capacity;
    local_1f18 = puVar2;
  }
  local_1ef0 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  paVar7->_M_local_buf[0] = '\0';
  if (local_1f18 == &local_1f08) {
    uStack_1ee0 = uStack_1f00;
    local_1ef8 = &local_1ee8;
  }
  else {
    local_1ef8 = local_1f18;
  }
  local_1ee8 = local_1f08;
  local_1f10 = 0;
  local_1f08 = local_1f08 & 0xffffffffffffff00;
  pcVar13 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:756:9)>
            ::_M_manager;
  name_01._M_string_length = in_stack_ffffffffffffdbe0;
  name_01._M_dataplus._M_p = &stack0xffffffffffffdc08;
  name_01.field_2._M_allocated_capacity = (size_type)in_RDI;
  name_01.field_2._8_8_ = in_stack_ffffffffffffdbf0;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)std::
                  _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:756:9)>
                  ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)std::
                  _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:756:9)>
                  ::_M_manager;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffdc28;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffdc38._0_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffdc38._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = in_stack_ffffffffffffdc30;
  examples.m_examples._M_string_length = (size_type)in_stack_ffffffffffffdc50;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_ffffffffffffdc48;
  examples.m_examples.field_2 = in_stack_ffffffffffffdc58;
  local_1f18 = &local_1f08;
  RPCHelpMan::RPCHelpMan
            (in_RDI,name_01,(string)ZEXT1632(CONCAT88(pRVar12,pRVar11)),args,results,examples,
             (RPCMethodImpl *)&local_58);
  if (pcVar13 != (code *)0x0) {
    (*pcVar13)(&stack0xffffffffffffdc08,&stack0xffffffffffffdc08,3);
  }
  if (local_1ef8 != &local_1ee8) {
    operator_delete(local_1ef8,local_1ee8 + 1);
  }
  if (local_1f18 != &local_1f08) {
    operator_delete(local_1f18,local_1f08 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f98._M_dataplus._M_p != &local_1f98.field_2) {
    operator_delete(local_1f98._M_dataplus._M_p,local_1f98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd8._M_dataplus._M_p != &local_1fd8.field_2) {
    operator_delete(local_1fd8._M_dataplus._M_p,local_1fd8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fb8._M_dataplus._M_p != &local_1fb8.field_2) {
    operator_delete(local_1fb8._M_dataplus._M_p,local_1fb8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f38._M_dataplus._M_p != &local_1f38.field_2) {
    operator_delete(local_1f38._M_dataplus._M_p,local_1f38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f78._M_dataplus._M_p != &local_1f78.field_2) {
    operator_delete(local_1f78._M_dataplus._M_p,local_1f78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f58._M_dataplus._M_p != &local_1f58.field_2) {
    operator_delete(local_1f58._M_dataplus._M_p,local_1f58.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2010);
  lVar8 = 0x220;
  do {
    if ((long *)((long)local_6e0 + lVar8) != *(long **)((long)local_6f0 + lVar8)) {
      operator_delete(*(long **)((long)local_6f0 + lVar8),*(long *)((long)local_6e0 + lVar8) + 1);
    }
    if ((long *)((long)local_700 + lVar8) != *(long **)((long)local_710 + lVar8)) {
      operator_delete(*(long **)((long)local_710 + lVar8),*(long *)((long)local_700 + lVar8) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_730.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar8));
    if ((long *)((long)local_740 + lVar8) != *(long **)((long)local_750 + lVar8)) {
      operator_delete(*(long **)((long)local_750 + lVar8),*(long *)((long)local_740 + lVar8) + 1);
    }
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffdc88);
  lVar8 = 0x110;
  do {
    if ((long *)(local_1d18 + lVar8) != *(long **)((long)local_1d28 + lVar8)) {
      operator_delete(*(long **)((long)local_1d28 + lVar8),*(long *)(local_1d18 + lVar8) + 1);
    }
    if ((long *)((long)local_1d38 + lVar8) != *(long **)((long)local_1d48 + lVar8)) {
      operator_delete(*(long **)((long)local_1d48 + lVar8),*(long *)((long)local_1d38 + lVar8) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_1d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar8));
    if ((long *)((long)local_1d78 + lVar8) != *(long **)((long)local_1d88 + lVar8)) {
      operator_delete(*(long **)((long)local_1d88 + lVar8),*(long *)((long)local_1d78 + lVar8) + 1);
    }
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffdc50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e10.m_cond._M_dataplus._M_p != &local_1e10.m_cond.field_2) {
    operator_delete(local_1e10.m_cond._M_dataplus._M_p,
                    local_1e10.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e10.m_description._M_dataplus._M_p != &local_1e10.m_description.field_2) {
    operator_delete(local_1e10.m_description._M_dataplus._M_p,
                    local_1e10.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1e10.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e10.m_key_name._M_dataplus._M_p != &local_1e10.m_key_name.field_2) {
    operator_delete(local_1e10.m_key_name._M_dataplus._M_p,
                    local_1e10.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffdc38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ed8.m_cond._M_dataplus._M_p != &local_1ed8.m_cond.field_2) {
    operator_delete(local_1ed8.m_cond._M_dataplus._M_p,
                    local_1ed8.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ed8.m_description._M_dataplus._M_p != &local_1ed8.m_description.field_2) {
    operator_delete(local_1ed8.m_description._M_dataplus._M_p,
                    local_1ed8.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1ed8.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ed8.m_key_name._M_dataplus._M_p != &local_1ed8.m_key_name.field_2) {
    operator_delete(local_1ed8.m_key_name._M_dataplus._M_p,
                    local_1ed8.m_key_name.field_2._M_allocated_capacity + 1);
  }
  if (local_1e50[0] != local_1e40) {
    operator_delete(local_1e50[0],local_1e40[0] + 1);
  }
  if (local_1e30[0] != local_1e20) {
    operator_delete(local_1e30[0],local_1e20[0] + 1);
  }
  if (local_1d88[0] != local_1d78) {
    operator_delete(local_1d88[0],local_1d78[0] + 1);
  }
  if (local_1d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_1d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_1d68.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffdc68);
  if (local_1d48[0] != local_1d38) {
    operator_delete(local_1d48[0],local_1d38[0] + 1);
  }
  if (local_1d28[0] != (pointer)local_1d18) {
    operator_delete(local_1d28[0],local_1d18._0_8_ + 1);
  }
  if (local_1bf8[0] != local_1be8) {
    operator_delete(local_1bf8[0],local_1be8[0] + 1);
  }
  if (local_1bd8[0] != local_1bc8) {
    operator_delete(local_1bd8[0],local_1bc8[0] + 1);
  }
  if (local_1bb8[0] != local_1ba8) {
    operator_delete(local_1bb8[0],local_1ba8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_22c8);
  lVar8 = 0x110;
  do {
    if ((long *)((long)local_18b0 + lVar8) != *(long **)((long)local_18c0 + lVar8)) {
      operator_delete(*(long **)((long)local_18c0 + lVar8),*(long *)((long)local_18b0 + lVar8) + 1);
    }
    if ((long *)((long)local_18d0 + lVar8) != *(long **)((long)local_18e0 + lVar8)) {
      operator_delete(*(long **)((long)local_18e0 + lVar8),*(long *)((long)local_18d0 + lVar8) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_1900.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar8));
    if ((long *)((long)local_1910 + lVar8) != *(long **)((long)local_1920 + lVar8)) {
      operator_delete(*(long **)((long)local_1920 + lVar8),*(long *)((long)local_1910 + lVar8) + 1);
    }
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_19a8.m_cond._M_dataplus._M_p != &local_19a8.m_cond.field_2) {
    operator_delete(local_19a8.m_cond._M_dataplus._M_p,
                    local_19a8.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_19a8.m_description._M_dataplus._M_p != &local_19a8.m_description.field_2) {
    operator_delete(local_19a8.m_description._M_dataplus._M_p,
                    local_19a8.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_19a8.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_19a8.m_key_name._M_dataplus._M_p != &local_19a8.m_key_name.field_2) {
    operator_delete(local_19a8.m_key_name._M_dataplus._M_p,
                    local_19a8.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2318);
  lVar8 = 0x110;
  do {
    if ((long *)(local_1b08 + lVar8) != *(long **)((long)local_1b18 + lVar8)) {
      operator_delete(*(long **)((long)local_1b18 + lVar8),*(long *)(local_1b08 + lVar8) + 1);
    }
    if ((long *)((long)local_1b28 + lVar8) != *(long **)((long)local_1b38 + lVar8)) {
      operator_delete(*(long **)((long)local_1b38 + lVar8),*(long *)((long)local_1b28 + lVar8) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_1b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar8));
    if ((long *)((long)local_1b68 + lVar8) != *(long **)((long)&local_1b78 + lVar8)) {
      operator_delete(*(long **)((long)&local_1b78 + lVar8),*(long *)((long)local_1b68 + lVar8) + 1)
      ;
    }
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffdca8);
  if (local_1b78 != local_1b68) {
    operator_delete(local_1b78,local_1b68[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b98._M_dataplus._M_p != &local_1b98.field_2) {
    operator_delete(local_1b98._M_dataplus._M_p,local_1b98.field_2._M_allocated_capacity + 1);
  }
  if (local_1b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_1b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_1b58.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2338);
  if (local_1b38[0] != local_1b28) {
    operator_delete(local_1b38[0],local_1b28[0] + 1);
  }
  if (local_1b18[0] != (pointer)local_1b08) {
    operator_delete(local_1b18[0],local_1b08._0_8_ + 1);
  }
  if (local_19e8[0] != local_19d8) {
    operator_delete(local_19e8[0],local_19d8[0] + 1);
  }
  if (local_19c8[0] != local_19b8) {
    operator_delete(local_19c8[0],local_19b8[0] + 1);
  }
  if (local_1920[0] != local_1910) {
    operator_delete(local_1920[0],local_1910[0] + 1);
  }
  if (local_1900.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1900.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_1900.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_1900.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_22e8);
  if (local_18e0[0] != local_18d0) {
    operator_delete(local_18e0[0],local_18d0[0] + 1);
  }
  if (local_18c0[0] != local_18b0) {
    operator_delete(local_18c0[0],local_18b0[0] + 1);
  }
  if (local_1790[0] != local_1780) {
    operator_delete(local_1790[0],local_1780[0] + 1);
  }
  if (local_1770[0] != local_1760) {
    operator_delete(local_1770[0],local_1760[0] + 1);
  }
  if (local_1750[0] != local_1740) {
    operator_delete(local_1750[0],local_1740[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2040);
  lVar8 = 0xa18;
  do {
    if ((long *)(local_11b8 + lVar8) != *(long **)((long)local_11c8 + lVar8)) {
      operator_delete(*(long **)((long)local_11c8 + lVar8),*(long *)(local_11b8 + lVar8) + 1);
    }
    if ((long *)((long)local_11d8 + lVar8) != *(long **)((long)local_11e8 + lVar8)) {
      operator_delete(*(long **)((long)local_11e8 + lVar8),*(long *)((long)local_11d8 + lVar8) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_1208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar8));
    if ((long *)((long)local_1218 + lVar8) != *(long **)((long)local_1228 + lVar8)) {
      operator_delete(*(long **)((long)local_1228 + lVar8),*(long *)((long)local_1218 + lVar8) + 1);
    }
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_22a8);
  if (local_1730[0] != local_1720) {
    operator_delete(local_1730[0],local_1720[0] + 1);
  }
  if (local_1710[0] != local_1700) {
    operator_delete(local_1710[0],local_1700[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2288);
  if (local_16f0[0] != local_16e0) {
    operator_delete(local_16f0[0],local_16e0[0] + 1);
  }
  if (local_16d0[0] != local_16c0) {
    operator_delete(local_16d0[0],local_16c0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2268);
  if (local_16b0[0] != local_16a0) {
    operator_delete(local_16b0[0],local_16a0[0] + 1);
  }
  if (local_1690[0] != local_1680) {
    operator_delete(local_1690[0],local_1680[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2248);
  if (local_1670[0] != local_1660) {
    operator_delete(local_1670[0],local_1660[0] + 1);
  }
  if (local_1650[0] != local_1640) {
    operator_delete(local_1650[0],local_1640[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2228);
  if (local_1630[0] != local_1620) {
    operator_delete(local_1630[0],local_1620[0] + 1);
  }
  if (local_1610[0] != local_1600) {
    operator_delete(local_1610[0],local_1600[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2208);
  if (local_15f0[0] != local_15e0) {
    operator_delete(local_15f0[0],local_15e0[0] + 1);
  }
  if (local_15d0[0] != local_15c0) {
    operator_delete(local_15d0[0],local_15c0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_21e8);
  if (local_15b0[0] != local_15a0) {
    operator_delete(local_15b0[0],local_15a0[0] + 1);
  }
  if (local_1590[0] != local_1580) {
    operator_delete(local_1590[0],local_1580[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_21c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1570._M_dataplus._M_p != &local_1570.field_2) {
    operator_delete(local_1570._M_dataplus._M_p,local_1570.field_2._M_allocated_capacity + 1);
  }
  if (local_1550[0] != local_1540) {
    operator_delete(local_1550[0],local_1540[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_21a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1530._M_dataplus._M_p != &local_1530.field_2) {
    operator_delete(local_1530._M_dataplus._M_p,local_1530.field_2._M_allocated_capacity + 1);
  }
  if (local_1510[0] != local_1500) {
    operator_delete(local_1510[0],local_1500[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14b0.m_cond._M_dataplus._M_p != &local_14b0.m_cond.field_2) {
    operator_delete(local_14b0.m_cond._M_dataplus._M_p,
                    local_14b0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14b0.m_description._M_dataplus._M_p != &local_14b0.m_description.field_2) {
    operator_delete(local_14b0.m_description._M_dataplus._M_p,
                    local_14b0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_14b0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14b0.m_key_name._M_dataplus._M_p != &local_14b0.m_key_name.field_2) {
    operator_delete(local_14b0.m_key_name._M_dataplus._M_p,
                    local_14b0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2188);
  if (local_14f0[0] != local_14e0) {
    operator_delete(local_14f0[0],local_14e0[0] + 1);
  }
  if (local_14d0[0] != local_14c0) {
    operator_delete(local_14d0[0],local_14c0[0] + 1);
  }
  if (local_1428[0] != local_1418) {
    operator_delete(local_1428[0],local_1418[0] + 1);
  }
  if (local_1408[0] != local_13f8) {
    operator_delete(local_1408[0],local_13f8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2158);
  if (local_13e8[0] != local_13d8) {
    operator_delete(local_13e8[0],local_13d8[0] + 1);
  }
  if (local_13c8[0] != local_13b8) {
    operator_delete(local_13c8[0],local_13b8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2138);
  if (local_13a8[0] != local_1398) {
    operator_delete(local_13a8[0],local_1398[0] + 1);
  }
  if (local_1388[0] != local_1378) {
    operator_delete(local_1388[0],local_1378[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2118);
  if (local_1368[0] != local_1358) {
    operator_delete(local_1368[0],local_1358[0] + 1);
  }
  if (local_1348[0] != local_1338) {
    operator_delete(local_1348[0],local_1338[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_20f8);
  if (local_1328[0] != local_1318) {
    operator_delete(local_1328[0],local_1318[0] + 1);
  }
  if (local_1308[0] != local_12f8) {
    operator_delete(local_1308[0],local_12f8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_20d8);
  if (local_12e8[0] != local_12d8) {
    operator_delete(local_12e8[0],local_12d8[0] + 1);
  }
  if (local_12c8[0] != local_12b8) {
    operator_delete(local_12c8[0],local_12b8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_20b8);
  if (local_12a8[0] != local_1298) {
    operator_delete(local_12a8[0],local_1298[0] + 1);
  }
  if (local_1288[0] != local_1278) {
    operator_delete(local_1288[0],local_1278[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2098);
  if (local_1268[0] != local_1258) {
    operator_delete(local_1268[0],local_1258[0] + 1);
  }
  if (local_1248[0] != local_1238) {
    operator_delete(local_1248[0],local_1238[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2078);
  if (local_1228[0] != local_1218) {
    operator_delete(local_1228[0],local_1218[0] + 1);
  }
  if (local_1208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_1208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_1208.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2058);
  if (local_11e8[0] != local_11d8) {
    operator_delete(local_11e8[0],local_11d8[0] + 1);
  }
  if (local_11c8[0] != (pointer)local_11b8) {
    operator_delete(local_11c8[0],local_11b8._0_8_ + 1);
  }
  if (local_790[0] != local_780) {
    operator_delete(local_790[0],local_780[0] + 1);
  }
  if (local_770[0] != local_760) {
    operator_delete(local_770[0],local_760[0] + 1);
  }
  if (local_750[0] != local_740) {
    operator_delete(local_750[0],local_740[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2028);
  if (local_730.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_730.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_730.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_730.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  if (local_710[0] != local_700) {
    operator_delete(local_710[0],local_700[0] + 1);
  }
  if (local_6f0[0] != local_6e0) {
    operator_delete(local_6f0[0],local_6e0[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1ff0);
  lVar8 = 0x210;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_2a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar8));
    plVar3 = *(long **)((long)&local_308 + lVar8 + 0x40);
    plVar6 = (long *)((long)&local_308 + lVar8 + 0x50);
    if (plVar6 != plVar3) {
      operator_delete(plVar3,*plVar6 + 1);
    }
    plVar6 = (long *)((long)&local_308 + lVar8 + 0x28);
    plVar3 = *(long **)((long)&local_308 + lVar8 + 0x18);
    if (plVar6 != plVar3) {
      operator_delete(plVar3,*plVar6 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_350 + lVar8));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + lVar8
               ));
    if ((long *)((long)local_380 + lVar8) != *(long **)((long)local_390 + lVar8)) {
      operator_delete(*(long **)((long)local_390 + lVar8),*(long *)((long)local_380 + lVar8) + 1);
    }
    lVar8 = lVar8 + -0x108;
  } while (lVar8 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_488);
  if (local_4a8 != &local_498) {
    operator_delete(local_4a8,CONCAT71(uStack_497,local_498) + 1);
  }
  if (local_468[0] != local_458) {
    operator_delete(local_468[0],local_458[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_3f0._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_448.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_448.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448.val._M_dataplus._M_p != &local_448.val.field_2) {
    operator_delete(local_448.val._M_dataplus._M_p,
                    CONCAT71(local_448.val.field_2._M_allocated_capacity._1_7_,
                             local_448.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_390[0] != local_380) {
    operator_delete(local_390[0],local_380[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_348);
  if (local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_328[0] != local_318) {
    operator_delete(local_328[0],local_318[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_308._M_first);
  if (local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_2a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_2a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_2a8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getblock()
{
    return RPCHelpMan{"getblock",
                "\nIf verbosity is 0, returns a string that is serialized, hex-encoded data for block 'hash'.\n"
                "If verbosity is 1, returns an Object with information about block <hash>.\n"
                "If verbosity is 2, returns an Object with information about block <hash> and information about each transaction.\n"
                "If verbosity is 3, returns an Object with information about block <hash> and information about each transaction, including prevout information for inputs (only for unpruned blocks in the current best chain).\n",
                {
                    {"blockhash", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The block hash"},
                    {"verbosity|verbose", RPCArg::Type::NUM, RPCArg::Default{1}, "0 for hex-encoded data, 1 for a JSON object, 2 for JSON object with transaction data, and 3 for JSON object with transaction data including prevout information for inputs",
                     RPCArgOptions{.skip_type_check = true}},
                },
                {
                    RPCResult{"for verbosity = 0",
                RPCResult::Type::STR_HEX, "", "A string that is serialized, hex-encoded data for block 'hash'"},
                    RPCResult{"for verbosity = 1",
                RPCResult::Type::OBJ, "", "",
                {
                    {RPCResult::Type::STR_HEX, "hash", "the block hash (same as provided)"},
                    {RPCResult::Type::NUM, "confirmations", "The number of confirmations, or -1 if the block is not on the main chain"},
                    {RPCResult::Type::NUM, "size", "The block size"},
                    {RPCResult::Type::NUM, "strippedsize", "The block size excluding witness data"},
                    {RPCResult::Type::NUM, "weight", "The block weight as defined in BIP 141"},
                    {RPCResult::Type::NUM, "height", "The block height or index"},
                    {RPCResult::Type::NUM, "version", "The block version"},
                    {RPCResult::Type::STR_HEX, "versionHex", "The block version formatted in hexadecimal"},
                    {RPCResult::Type::STR_HEX, "merkleroot", "The merkle root"},
                    {RPCResult::Type::ARR, "tx", "The transaction ids",
                        {{RPCResult::Type::STR_HEX, "", "The transaction id"}}},
                    {RPCResult::Type::NUM_TIME, "time",       "The block time expressed in " + UNIX_EPOCH_TIME},
                    {RPCResult::Type::NUM_TIME, "mediantime", "The median block time expressed in " + UNIX_EPOCH_TIME},
                    {RPCResult::Type::NUM, "nonce", "The nonce"},
                    {RPCResult::Type::STR_HEX, "bits", "The bits"},
                    {RPCResult::Type::NUM, "difficulty", "The difficulty"},
                    {RPCResult::Type::STR_HEX, "chainwork", "Expected number of hashes required to produce the chain up to this block (in hex)"},
                    {RPCResult::Type::NUM, "nTx", "The number of transactions in the block"},
                    {RPCResult::Type::STR_HEX, "previousblockhash", /*optional=*/true, "The hash of the previous block (if available)"},
                    {RPCResult::Type::STR_HEX, "nextblockhash", /*optional=*/true, "The hash of the next block (if available)"},
                }},
                    RPCResult{"for verbosity = 2",
                RPCResult::Type::OBJ, "", "",
                {
                    {RPCResult::Type::ELISION, "", "Same output as verbosity = 1"},
                    {RPCResult::Type::ARR, "tx", "",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::ELISION, "", "The transactions in the format of the getrawtransaction RPC. Different from verbosity = 1 \"tx\" result"},
                            {RPCResult::Type::NUM, "fee", "The transaction fee in " + CURRENCY_UNIT + ", omitted if block undo data is not available"},
                        }},
                    }},
                }},
                    RPCResult{"for verbosity = 3",
                RPCResult::Type::OBJ, "", "",
                {
                    {RPCResult::Type::ELISION, "", "Same output as verbosity = 2"},
                    {RPCResult::Type::ARR, "tx", "",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            getblock_vin,
                        }},
                    }},
                }},
        },
                RPCExamples{
                    HelpExampleCli("getblock", "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"")
            + HelpExampleRpc("getblock", "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    uint256 hash(ParseHashV(request.params[0], "blockhash"));

    int verbosity = 1;
    if (!request.params[1].isNull()) {
        if (request.params[1].isBool()) {
            verbosity = request.params[1].get_bool() ? 1 : 0;
        } else {
            verbosity = request.params[1].getInt<int>();
        }
    }

    const CBlockIndex* pblockindex;
    const CBlockIndex* tip;
    ChainstateManager& chainman = EnsureAnyChainman(request.context);
    {
        LOCK(cs_main);
        pblockindex = chainman.m_blockman.LookupBlockIndex(hash);
        tip = chainman.ActiveChain().Tip();

        if (!pblockindex) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block not found");
        }
    }

    const std::vector<uint8_t> block_data{GetRawBlockChecked(chainman.m_blockman, *pblockindex)};

    if (verbosity <= 0) {
        return HexStr(block_data);
    }

    DataStream block_stream{block_data};
    CBlock block{};
    block_stream >> TX_WITH_WITNESS(block);

    TxVerbosity tx_verbosity;
    if (verbosity == 1) {
        tx_verbosity = TxVerbosity::SHOW_TXID;
    } else if (verbosity == 2) {
        tx_verbosity = TxVerbosity::SHOW_DETAILS;
    } else {
        tx_verbosity = TxVerbosity::SHOW_DETAILS_AND_PREVOUT;
    }

    return blockToJSON(chainman.m_blockman, block, *tip, *pblockindex, tx_verbosity);
},
    };
}